

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  pointer pcVar1;
  size_type sVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  long *local_60;
  undefined8 local_58;
  long local_50 [2];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  long *local_28;
  
  pcVar1 = (this->HomeRelativeOutputPath)._M_dataplus._M_p;
  sVar2 = (this->HomeRelativeOutputPath)._M_string_length;
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
            (&local_60);
  local_30 = local_58;
  local_28 = local_60;
  views._M_len = 2;
  views._M_array = &local_40;
  local_40._M_len = sVar2;
  local_40._M_str = pcVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir =
    cmStrCat(this->HomeRelativeOutputPath, this->GetTargetDirectory(target));
  return dir;
}